

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec3 val)

{
  pointer pGVar1;
  undefined1 auVar2 [16];
  __type _Var3;
  invalid_argument *piVar4;
  pointer __lhs;
  undefined8 in_XMM0_Qb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*glad_glUseProgram)(this->programHandle);
  __lhs = (this->uniforms).
          super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Tried to set nonexistent uniform with name ",name);
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    _Var3 = std::operator==(&__lhs->name,name);
    if (_Var3) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->type == Vector3Float) {
    auVar2._8_8_ = in_XMM0_Qb;
    auVar2._0_8_ = val._0_8_;
    auVar2 = vmovshdup_avx(auVar2);
    (*glad_glUniform3f)(__lhs->location,val.field_0.x,auVar2._0_4_,val.field_2.z);
    __lhs->isSet = true;
    return;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Tried to set GLShaderUniform with wrong type");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec3 val) {
  glUseProgram(programHandle);

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Vector3Float) {
        glUniform3f(u.location, val.x, val.y, val.z);
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}